

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::update_b(OjaNewton *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  
  uVar4 = (ulong)(uint)this->m;
  if (0 < this->m) {
    lVar2 = 0;
    lVar3 = 1;
    do {
      fVar6 = 0.0;
      lVar5 = lVar2;
      do {
        fVar6 = fVar6 + ((this->data).AZx[lVar5 + 1] * this->ev[lVar5 + 1] *
                        this->A[lVar5 + 1][lVar3]) /
                        ((this->ev[lVar5 + 1] + this->alpha) * this->alpha);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)uVar4);
      this->b[lVar3] = fVar6 * (this->data).g + this->b[lVar3];
      uVar4 = (ulong)this->m;
      lVar2 = lVar2 + 1;
      bVar1 = lVar3 < (long)uVar4;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void update_b()
  {
    for (int j = 1; j <= m; j++)
    {
      float tmp = 0;
      for (int i = j; i <= m; i++)
      {
        tmp += ev[i] * data.AZx[i] * A[i][j] / (alpha * (alpha + ev[i]));
      }
      b[j] += tmp * data.g;
    }
  }